

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunator.hpp
# Opt level: O2

int __thiscall delaunator::Delaunator::link(Delaunator *this,char *__from,char *__to)

{
  pointer extraout_RAX;
  pointer extraout_RAX_00;
  pointer puVar1;
  runtime_error *this_00;
  char *pcVar2;
  ulong uVar3;
  char *local_38;
  size_t a_local;
  size_t b_local;
  
  puVar1 = (this->halfedges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (char *)((long)(this->halfedges).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
  local_38 = __from;
  a_local = (size_t)__to;
  if (pcVar2 == __from) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->halfedges,&a_local)
    ;
    puVar1 = extraout_RAX;
  }
  else {
    if (pcVar2 <= __from) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Cannot link edge");
      goto LAB_0010d62d;
    }
    puVar1[(long)__from] = (unsigned_long)__to;
  }
  if (a_local != 0xffffffffffffffff) {
    puVar1 = (this->halfedges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar3 = (long)(this->halfedges).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
    if (a_local == uVar3) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->halfedges,(value_type_conflict2 *)&local_38);
      puVar1 = extraout_RAX_00;
    }
    else {
      if (uVar3 <= a_local) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Cannot link edge");
LAB_0010d62d:
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      puVar1[a_local] = (unsigned_long)__from;
    }
  }
  return (int)puVar1;
}

Assistant:

void Delaunator::link(const std::size_t a, const std::size_t b) {
    std::size_t s = halfedges.size();
    if (a == s) {
        halfedges.push_back(b);
    } else if (a < s) {
        halfedges[a] = b;
    } else {
        throw std::runtime_error("Cannot link edge");
    }
    if (b != INVALID_INDEX) {
        std::size_t s2 = halfedges.size();
        if (b == s2) {
            halfedges.push_back(a);
        } else if (b < s2) {
            halfedges[b] = a;
        } else {
            throw std::runtime_error("Cannot link edge");
        }
    }
}